

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * muduo::ProcessInfo::threads(void)

{
  iterator __first;
  vector<int,_std::allocator<int>_> *in_RDI;
  long in_FS_OFFSET;
  vector<int,_std::allocator<int>_> *result;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  char *in_stack_ffffffffffffffd0;
  
  __last._M_current = (int *)in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14e5a0);
  *(int **)(in_FS_OFFSET + -8) = __last._M_current;
  detail::scanDir(in_stack_ffffffffffffffd0,(_func_int_dirent_ptr *)__last._M_current);
  *(undefined8 *)(in_FS_OFFSET + -8) = 0;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffb8);
  __first = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffb8);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             __last);
  return in_RDI;
}

Assistant:

std::vector<pid_t> ProcessInfo::threads()
{
  std::vector<pid_t> result;
  t_pids = &result;
  scanDir("/proc/self/task", taskDirFilter);
  t_pids = NULL;
  std::sort(result.begin(), result.end());
  return result;
}